

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_style_set_font(nk_context *ctx,nk_user_font *font)

{
  float fVar1;
  nk_panel *pnVar2;
  float fVar3;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x39e4,"void nk_style_set_font(struct nk_context *, const struct nk_user_font *)"
                 );
  }
  (ctx->style).font = font;
  (ctx->stacks).fonts.head = 0;
  if (ctx->current == (nk_window *)0x0) {
    return;
  }
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x44c5,"void nk_layout_reset_min_row_height(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar2 = ctx->current->layout;
    if (pnVar2 != (nk_panel *)0x0) {
      fVar3 = ((ctx->style).font)->height;
      (pnVar2->row).min_height = fVar3;
      fVar1 = (ctx->style).text.padding.y;
      fVar3 = fVar1 + fVar1 + fVar3;
      (pnVar2->row).min_height = fVar3;
      fVar1 = (ctx->style).window.min_row_height_padding;
      (pnVar2->row).min_height = fVar1 + fVar1 + fVar3;
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x44c7,"void nk_layout_reset_min_row_height(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x44c6,"void nk_layout_reset_min_row_height(struct nk_context *)");
}

Assistant:

NK_API void
nk_style_set_font(struct nk_context *ctx, const struct nk_user_font *font)
{
    struct nk_style *style;
    NK_ASSERT(ctx);

    if (!ctx) return;
    style = &ctx->style;
    style->font = font;
    ctx->stacks.fonts.head = 0;
    if (ctx->current)
        nk_layout_reset_min_row_height(ctx);
}